

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEException.cpp
# Opt level: O0

void __thiscall
CEException::sofa_error::sofa_error
          (sofa_error *this,string *origin,string *sofa_method,int *errcode,string *message)

{
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_R8;
  string *origin_00;
  CEExceptionHandler *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [55];
  undefined1 local_49 [73];
  
  origin_00 = (string *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_49 + 1),"SOFA error",(allocator *)origin_00);
  CEExceptionHandler::CEExceptionHandler(in_stack_fffffffffffffee0,origin_00,in_R8,in_RSI);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  *(undefined ***)in_RDI = &PTR__sofa_error_0017b978;
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 in_stack_ffffffffffffff00);
  std::operator+(in_RSI,(char *)in_RDI);
  std::__cxx11::to_string(in_stack_ffffffffffffff0c);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator+(in_RSI,(char *)in_RDI);
  std::operator+(in_RSI,in_RDI);
  (**(code **)(*(long *)in_RDI + 0x20))(in_RDI,local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  return;
}

Assistant:

CEException::sofa_error::sofa_error(const std::string& origin,
                                    const std::string& sofa_method,
                                    const int&         errcode,
                                    const std::string& message) :
    CEExceptionHandler(origin, message, "SOFA error")
{
    // Overwrite the message
    this->message("SOFA method: " + sofa_method + ", ErrCode: "+ std::to_string(errcode) +
                  "\n" + message);
}